

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_16x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int shift;
  int fliplr;
  int flipud;
  __m128i in [256];
  
  piVar1 = av1_fwd_txfm_shift_ls[0x11];
  flipud = 0;
  fliplr = 0;
  if ((byte)(tx_type - 4) < 0xc) {
    lVar2 = (ulong)(byte)(tx_type - 4) * 4;
    flipud = *(int *)(&DAT_004c1a9c + lVar2);
    fliplr = *(int *)(&DAT_004c1acc + lVar2);
  }
  lVar2 = (long)stride;
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 4) {
    shift = (int)*piVar1;
    load_buffer_4x4(input,(__m128i *)((long)in[0] + lVar4),4,flipud,fliplr,shift);
    load_buffer_4x4(input + lVar2,(__m128i *)((long)in[4] + lVar4),4,flipud,fliplr,shift);
    load_buffer_4x4(input + lVar2 * 2,(__m128i *)((long)in[8] + lVar4),4,flipud,fliplr,shift);
    load_buffer_4x4(input + lVar2 * 3,(__m128i *)((long)in[0xc] + lVar4),4,flipud,fliplr,shift);
    lVar4 = lVar4 + 0x100;
    input = input + lVar2 * 4;
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    av1_fdct64_sse4_1((__m128i *)((long)in[0] + lVar2),(__m128i *)((long)coeff + lVar2),'\r',4,4);
  }
  col_txfm_16x16_rounding((__m128i *)coeff,-(int)piVar1[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x100),-(int)piVar1[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x200),-(int)piVar1[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x300),-(int)piVar1[1]);
  transpose_8nx8n((__m128i *)coeff,in,0x10,0x20);
  fdct16x16_sse4_1(in,(__m128i *)coeff,0xc,8);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X64];
  const int txw_idx = get_txw_idx(TX_16X64);
  const int txh_idx = get_txh_idx(TX_16X64);
  const int txfm_size_col = tx_size_wide[TX_16X64];
  const int txfm_size_row = tx_size_high[TX_16X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int num_col = txfm_size_col >> 2;
  // col tranform
  for (int i = 0; i < txfm_size_row; i += num_col) {
    load_buffer_4x4(input + (i + 0) * stride, in + (i + 0) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 1) * stride, in + (i + 1) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 2) * stride, in + (i + 2) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 3) * stride, in + (i + 3) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitcol, num_col, num_col);
  }

  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, 32);
  fdct16x16_sse4_1(in, outcoeff128, bitrow, 8);
  (void)bd;
}